

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<unsigned_long>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,unsigned_long *args)

{
  format_args args_00;
  string_view fmt_00;
  char *s;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RDI;
  undefined8 *in_R8;
  undefined8 in_stack_00000010;
  log_msg *in_stack_00000018;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffaf0;
  logger *in_stack_fffffffffffffaf8;
  logger *in_stack_fffffffffffffb00;
  basic_appender<char> *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffb38;
  level_enum lvl_00;
  log_msg *in_stack_fffffffffffffb60;
  string_view_t in_stack_fffffffffffffb68;
  string_view_t in_stack_fffffffffffffb78;
  source_loc in_stack_fffffffffffffb90;
  basic_string_view<char> local_408 [2];
  undefined2 uStack_3da;
  log_msg *local_3d8;
  buffer<char> *local_370;
  char *local_368;
  size_t local_360;
  undefined8 local_358;
  char **local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  basic_appender<char> local_338 [4];
  buffer<char> local_318 [9];
  undefined1 local_1f2;
  byte local_1f1;
  undefined8 *local_1f0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_100;
  undefined1 local_f8 [8];
  size_t local_f0;
  char *local_e8;
  undefined1 *local_e0;
  char **local_d8;
  undefined8 *local_d0;
  char *local_10;
  undefined1 *local_8;
  
  lvl_00 = (level_enum)((ulong)in_RDI >> 0x20);
  local_1f0 = in_R8;
  local_1d8 = in_RDX;
  uStack_1d0 = in_RCX;
  local_1f1 = should_log(in_stack_fffffffffffffaf8,
                         (level_enum)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
  local_1f2 = details::backtracer::enabled((backtracer *)0x27e6eb);
  if (((local_1f1 & 1) != 0) || ((bool)local_1f2)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffaf0,(allocator<char> *)in_stack_fffffffffffffae8);
    ::fmt::v11::basic_appender<char>::basic_appender(local_338,local_318);
    local_348 = local_1d8;
    uStack_340 = uStack_1d0;
    local_100 = local_1f0;
    local_368 = (char *)*local_1f0;
    local_e0 = local_f8;
    local_360 = local_f0;
    local_d0 = &local_358;
    local_d8 = &local_368;
    local_358 = 4;
    fmt_00.size_ = local_f0;
    fmt_00.data_ = local_368;
    args_00.desc_._4_4_ = in_stack_fffffffffffffb34;
    args_00.desc_._0_4_ = in_stack_fffffffffffffb30;
    args_00.field_1.args_ = in_stack_fffffffffffffb38.args_;
    local_e8 = local_368;
    local_10 = local_368;
    local_8 = local_e0;
    local_350 = local_d8;
    local_370 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffb28,fmt_00,args_00);
    local_3d8 = in_stack_00000018;
    uStack_3da = (undefined2)((ulong)in_stack_00000010 >> 0x30);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    s = ::fmt::v11::detail::buffer<char>::data(local_318);
    count = ::fmt::v11::detail::buffer<char>::size(local_318);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_408,s,count);
    details::log_msg::log_msg
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb90,in_stack_fffffffffffffb78,lvl_00,
               in_stack_fffffffffffffb68);
    log_it_(in_stack_fffffffffffffb00,local_3d8,SUB21((ushort)uStack_3da >> 8,0),SUB21(uStack_3da,0)
           );
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x27e958);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }